

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsaaudio.c
# Opt level: O2

int input_initialize(snd_pcm_t *handle,short **buffer,int *buffer_l,int channels_num,char *error_msg
                    )

{
  uint uVar1;
  int iVar2;
  long lVar3;
  size_t __n;
  short *__s;
  undefined8 uVar4;
  undefined8 uVar5;
  char *pcVar6;
  void *__s_00;
  size_t size_00;
  undefined8 uStack_50;
  short **local_48;
  undefined8 local_40;
  snd_pcm_uframes_t size;
  int dir;
  uint rate;
  
  uStack_50 = 0x10386a;
  local_48 = buffer;
  lVar3 = snd_pcm_hw_params_sizeof();
  lVar3 = -(lVar3 + 0xfU & 0xfffffffffffffff0);
  __s_00 = (void *)((long)&local_48 + lVar3);
  *(undefined8 *)((long)&uStack_50 + lVar3) = 0x103880;
  __n = snd_pcm_hw_params_sizeof();
  *(undefined8 *)((long)&uStack_50 + lVar3) = 0x10388d;
  memset(__s_00,0,__n);
  *(undefined8 *)((long)&uStack_50 + lVar3) = 0x103898;
  iVar2 = snd_pcm_hw_params_any(handle,__s_00);
  if (iVar2 < 0) {
    builtin_strncpy(error_msg,"Error initializing hwparams",0x1c);
    goto LAB_001039f2;
  }
  *(undefined8 *)((long)&uStack_50 + lVar3) = 3;
  uVar5 = *(undefined8 *)((long)&uStack_50 + lVar3);
  *(undefined8 *)((long)&uStack_50 + lVar3) = 0x1038ae;
  iVar2 = snd_pcm_hw_params_set_access(handle,__s_00,uVar5);
  if (iVar2 < 0) {
    *(undefined8 *)((long)&uStack_50 + lVar3) = 0x10399a;
    uVar5 = snd_strerror(iVar2);
    pcVar6 = "Error setting acecss mode (SND_PCM_ACCESS_RW_INTERLEAVED): %s";
  }
  else {
    *(undefined8 *)((long)&uStack_50 + lVar3) = 2;
    uVar5 = *(undefined8 *)((long)&uStack_50 + lVar3);
    *(undefined8 *)((long)&uStack_50 + lVar3) = 0x1038c4;
    iVar2 = snd_pcm_hw_params_set_format(handle,__s_00,uVar5);
    if (-1 < iVar2) {
      *(undefined8 *)((long)&uStack_50 + lVar3) = 0x1038da;
      iVar2 = snd_pcm_hw_params_set_channels(handle,__s_00,channels_num);
      if (iVar2 < 0) {
        *(undefined8 *)((long)&uStack_50 + lVar3) = 0x1039c7;
        uVar5 = snd_strerror(iVar2);
        pcVar6 = "Error setting channels %d: %s";
      }
      else {
        size._4_4_ = 48000;
        *(undefined8 *)((long)&uStack_50 + lVar3) = 0x1038f9;
        iVar2 = snd_pcm_hw_params_set_rate_near(handle,__s_00,(long)&size + 4,0);
        uVar1 = size._4_4_;
        if (-1 < iVar2) {
          local_40 = 0x1000;
          size._0_4_ = 0;
          *(undefined8 *)((long)&uStack_50 + lVar3) = 0x10391e;
          iVar2 = snd_pcm_hw_params_set_period_size_near(handle,__s_00);
          uVar5 = local_40;
          if (iVar2 < 0) {
            *(undefined8 *)((long)&uStack_50 + lVar3) = 0x103a11;
            uVar4 = snd_strerror(iVar2);
            *(undefined8 *)((long)&uStack_50 + lVar3) = 0x103a28;
            sprintf(error_msg,"Error setting buffer size (%lu): %s",uVar5,uVar4);
            goto LAB_001039f2;
          }
          *(undefined8 *)((long)&uStack_50 + lVar3) = 0x103931;
          iVar2 = snd_pcm_hw_params(handle,__s_00);
          if (-1 < iVar2) {
            *(undefined8 *)((long)&uStack_50 + lVar3) = 0x10394c;
            snd_pcm_hw_params_get_period_size(__s_00,&local_40,&size);
            *buffer_l = (int)local_40;
            size_00 = (size_t)(channels_num * (int)local_40 * 2);
            *(undefined8 *)((long)&uStack_50 + lVar3) = 0x103964;
            __s = (short *)hmalloc(size_00);
            *local_48 = __s;
            *(undefined8 *)((long)&uStack_50 + lVar3) = 0x10397a;
            memset(__s,0,size_00);
            return 0;
          }
          *(undefined8 *)((long)&uStack_50 + lVar3) = 0x103a31;
          uVar5 = snd_strerror(iVar2);
          pcVar6 = "Error writing hwparams: %s";
          goto LAB_001039b1;
        }
        *(undefined8 *)((long)&uStack_50 + lVar3) = 0x1039db;
        uVar5 = snd_strerror(iVar2);
        pcVar6 = "Error setting sample rate (%d): %s";
        channels_num = uVar1;
      }
      *(undefined8 *)((long)&uStack_50 + lVar3) = 0x1039f2;
      sprintf(error_msg,pcVar6,(ulong)(uint)channels_num,uVar5);
      goto LAB_001039f2;
    }
    *(undefined8 *)((long)&uStack_50 + lVar3) = 0x1039aa;
    uVar5 = snd_strerror(iVar2);
    pcVar6 = "Error setting format (SND_PCM_FORMAT_S16_LE): %s";
  }
LAB_001039b1:
  *(undefined8 *)((long)&uStack_50 + lVar3) = 0x1039be;
  sprintf(error_msg,pcVar6,uVar5);
LAB_001039f2:
  *(undefined8 *)((long)&uStack_50 + lVar3) = 0xffffffffffffffff;
  return (int)*(undefined8 *)((long)&uStack_50 + lVar3);
}

Assistant:

int input_initialize(snd_pcm_t * handle, short **buffer, int *buffer_l, int channels_num, char *error_msg)
{
	int err;
    int dir;

	snd_pcm_hw_params_t *hwparams = NULL;

	snd_pcm_hw_params_alloca(&hwparams);

	if ((err = snd_pcm_hw_params_any(handle, hwparams)) < 0) {
        sprintf(error_msg, "Error initializing hwparams");
		return -1;
	}

	if ((err = snd_pcm_hw_params_set_access(handle, hwparams, SND_PCM_ACCESS_RW_INTERLEAVED)) < 0) {
        sprintf(error_msg, "Error setting acecss mode (SND_PCM_ACCESS_RW_INTERLEAVED): %s", snd_strerror(err));
		return -1;
	}
	if ((err = snd_pcm_hw_params_set_format(handle, hwparams, SND_PCM_FORMAT_S16_LE)) < 0) {
        sprintf(error_msg, "Error setting format (SND_PCM_FORMAT_S16_LE): %s", snd_strerror(err));
		return -1;
	}
	
    if ((err = snd_pcm_hw_params_set_channels(handle, hwparams, channels_num)) < 0) {
        sprintf(error_msg, "Error setting channels %d: %s", channels_num, snd_strerror(err));
		return -1;
	}

	unsigned int rate = 48000;
	if ((err = snd_pcm_hw_params_set_rate_near(handle, hwparams, &rate, 0)) < 0) {
        sprintf(error_msg, "Error setting sample rate (%d): %s", rate, snd_strerror(err));
		return -1;
	}
	
	snd_pcm_uframes_t size = 4096; /* number of frames */
	
    dir = 0;
	if ((err = snd_pcm_hw_params_set_period_size_near(handle, hwparams, &size, &dir)) < 0) {
        sprintf(error_msg, "Error setting buffer size (%lu): %s", size, snd_strerror(err));
		return -1;
	}

	if ((err = snd_pcm_hw_params(handle, hwparams)) < 0) {
        sprintf(error_msg, "Error writing hwparams: %s", snd_strerror(err));
		return -1;
	}
	
	snd_pcm_hw_params_get_period_size(hwparams, &size, &dir);
	//int extra = (int) size % 5;
	//*buffer_l = (int) size - extra;
	*buffer_l = (int) size;
    int buffer_len_in_bytes = *buffer_l * sizeof(short) * channels_num;
	
//	hlog(LOG_DEBUG, LOGPREFIX "Using sound buffer size: %d frames of %d channels: %d bytes",
//		*buffer_l, channels, buffer_len_in_bytes);
	
	*buffer = (short *) hmalloc(buffer_len_in_bytes);
	bzero(*buffer, buffer_len_in_bytes);
	
	return 0;
}